

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

void nifti_set_iname_offset(nifti_image *nim)

{
  uint uVar1;
  uint uVar2;
  
  if (nim->nifti_type == 1) {
    uVar2 = nifti_extension_size(nim);
    uVar1 = uVar2 + 0x16f & 0xfffffff0;
    if ((uVar2 & 0xf) == 0) {
      uVar1 = uVar2 + 0x160;
    }
    if (nim->iname_offset != uVar1) {
      if (1 < g_opts_0) {
        fprintf(_stderr,"+d changing offset from %d to %d\n",(ulong)(uint)nim->iname_offset,
                (ulong)uVar1);
      }
      nim->iname_offset = uVar1;
    }
  }
  else if (nim->nifti_type == 3) {
    nim->iname_offset = -1;
  }
  else {
    nim->iname_offset = 0;
  }
  return;
}

Assistant:

void nifti_set_iname_offset(nifti_image *nim)
{
   int offset;

   switch( nim->nifti_type ){

     default:  /* writing into 2 files */
       /* we only write files with 0 offset in the 2 file format */
       nim->iname_offset = 0 ;
     break ;

     /* NIFTI-1 single binary file - always update */
     case NIFTI_FTYPE_NIFTI1_1:
       offset = nifti_extension_size(nim)+sizeof(struct nifti_1_header)+4;
       /* be sure offset is aligned to a 16 byte boundary */
       if ( ( offset % 16 ) != 0 )  offset = ((offset + 0xf) & ~0xf);
       if( nim->iname_offset != offset ){
          if( g_opts.debug > 1 )
             fprintf(stderr,"+d changing offset from %d to %d\n",
                  nim->iname_offset, offset);
          nim->iname_offset = offset;
       }
     break ;

     /* non-standard case: NIFTI-1 ASCII header + binary data (single file) */
     case NIFTI_FTYPE_ASCII:
       nim->iname_offset = -1 ;             /* compute offset from filesize */
     break ;
   }
}